

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.hpp
# Opt level: O2

void __thiscall
FastqReader<FastqRecord>::FastqReader
          (FastqReader<FastqRecord> *this,FastxReaderParams params,string *filepath)

{
  gzFile pgVar1;
  kstream<gzFile_s_*,_FunctorZlib> *pkVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  kseq::kseq(&this->seq);
  this->numRecords = 0;
  this->fq_File = 0;
  (this->params).min_length = params.min_length;
  (this->stats).totalRecords = 0;
  (this->stats).filteredRecords = 0;
  (this->stats).totalLength = 0;
  (this->stats).filteredLength = 0;
  this->eof_flag = false;
  pgVar1 = (gzFile)gzopen((filepath->_M_dataplus)._M_p,"r");
  this->gz_file = pgVar1;
  if (pgVar1 != (gzFile)0x0) {
    pkVar2 = (kstream<gzFile_s_*,_FunctorZlib> *)operator_new(0x30);
    kstream<gzFile_s_*,_FunctorZlib>::kstream(pkVar2,pgVar1);
    this->ks = pkVar2;
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Error opening FASTQ ");
  poVar3 = std::operator<<(poVar3,(string *)filepath);
  poVar3 = std::operator<<(poVar3,": ");
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_90,"Error opening ",filepath);
  std::operator+(&local_70,&local_90,": ");
  pcVar5 = strerror(*piVar4);
  std::operator+(&local_50,&local_70,pcVar5);
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit FastqReader(FastxReaderParams params, const std::string &filepath) : params(params), numRecords(0),eof_flag(false) {
        //sdglib::OutputLog() << "Opening: " << filepath << "\n";
        gz_file = gzopen(filepath.c_str(), "r");
        if (gz_file == Z_NULL) {
            std::cout << "Error opening FASTQ " << filepath << ": " << std::strerror(errno) << std::endl;
            throw std::runtime_error("Error opening " + filepath + ": " + std::strerror(errno));
        }
        ks = new kstream<gzFile, FunctorZlib>(gz_file, gzr);
    }